

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::ErrorResponse>::construct(BasicTypeInfo<dap::ErrorResponse> *this,void *ptr)

{
  memset(ptr,0,200);
  optional<dap::Message>::optional((optional<dap::Message> *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }